

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

void __thiscall
t_swift_generator::generate_swift_service_client
          (t_swift_generator *this,ostream *out,t_service *tservice)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  bool local_4a;
  allocator local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  t_service *local_28;
  t_service *parent;
  t_service *tservice_local;
  ostream *out_local;
  t_swift_generator *this_local;
  
  parent = tservice;
  tservice_local = (t_service *)out;
  out_local = (ostream *)this;
  if ((this->gen_cocoa_ & 1U) == 0) {
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"open class ");
    iVar1 = (*(parent->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar2 = std::operator<<(poVar2,(string *)CONCAT44(extraout_var,iVar1));
    std::operator<<(poVar2,"Client");
    local_28 = t_service::get_extends(parent);
    poVar2 = std::operator<<((ostream *)tservice_local," : ");
    local_4a = local_28 != (t_service *)0x0;
    if (local_4a) {
      iVar1 = (*(local_28->super_t_type).super_t_doc._vptr_t_doc[3])();
      std::operator+(&local_48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var_00,iVar1),"Client");
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_48,"TClient",&local_49);
    }
    local_4a = !local_4a;
    std::operator<<(poVar2,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if (local_4a) {
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
    poVar2 = std::operator<<((ostream *)tservice_local," /* , ");
    iVar1 = (*(parent->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar2 = std::operator<<(poVar2,(string *)CONCAT44(extraout_var_01,iVar1));
    std::operator<<(poVar2," */");
    block_open(this,(ostream *)tservice_local);
    std::operator<<((ostream *)tservice_local,(string *)&::endl_abi_cxx11_);
  }
  else {
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"public class ");
    iVar1 = (*(parent->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar2 = std::operator<<(poVar2,(string *)CONCAT44(extraout_var_02,iVar1));
    poVar2 = std::operator<<(poVar2,"Client /* : ");
    iVar1 = (*(parent->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar2 = std::operator<<(poVar2,(string *)CONCAT44(extraout_var_03,iVar1));
    std::operator<<(poVar2," */");
    block_open(this,(ostream *)tservice_local);
    std::operator<<((ostream *)tservice_local,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
    poVar2 = std::operator<<(poVar2,"let __inProtocol : TProtocol");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
    poVar2 = std::operator<<(poVar2,"let __outProtocol : TProtocol");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
    std::operator<<(poVar2,"public init(inoutProtocol: TProtocol)");
    block_open(this,(ostream *)tservice_local);
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
    poVar2 = std::operator<<(poVar2,"__inProtocol = inoutProtocol");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
    poVar2 = std::operator<<(poVar2,"__outProtocol = inoutProtocol");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    block_close(this,(ostream *)tservice_local,true);
    std::operator<<((ostream *)tservice_local,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
    std::operator<<(poVar2,"public init(inProtocol: TProtocol, outProtocol: TProtocol)");
    block_open(this,(ostream *)tservice_local);
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
    poVar2 = std::operator<<(poVar2,"__inProtocol = inProtocol");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
    poVar2 = std::operator<<(poVar2,"__outProtocol = outProtocol");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    block_close(this,(ostream *)tservice_local,true);
    std::operator<<((ostream *)tservice_local,(string *)&::endl_abi_cxx11_);
  }
  block_close(this,(ostream *)tservice_local,true);
  std::operator<<((ostream *)tservice_local,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_swift_generator::generate_swift_service_client(ostream& out, t_service* tservice) {
  if (!gen_cocoa_) {
    indent(out) << "open class " << tservice->get_name() << "Client";// : "

    // Inherit from ParentClient
    t_service* parent = tservice->get_extends();
    out << " : " << ((parent == nullptr) ? "TClient" : parent->get_name() + "Client");
    out <<  " /* , " << tservice->get_name() << " */";
    block_open(out);
    out << endl;
  } else {
    // a
    indent(out) << "public class " << tservice->get_name() << "Client /* : " << tservice->get_name() << " */";
    block_open(out);
    out << endl;

    indent(out) << "let __inProtocol : TProtocol" << endl << endl;
    indent(out) << "let __outProtocol : TProtocol" << endl << endl;
    indent(out) << "public init(inoutProtocol: TProtocol)";
    block_open(out);

    indent(out) << "__inProtocol = inoutProtocol" << endl;
    indent(out) << "__outProtocol = inoutProtocol" << endl;
    block_close(out);
    out << endl;

    indent(out) << "public init(inProtocol: TProtocol, outProtocol: TProtocol)";
    block_open(out);
    indent(out) << "__inProtocol = inProtocol" << endl;
    indent(out) << "__outProtocol = outProtocol" << endl;
    block_close(out);
    out << endl;
  }

  block_close(out);
  out << endl;
}